

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  byte bVar1;
  bool bVar2;
  ImGuiInputEvent *pIVar3;
  ImGuiKeyData *pIVar4;
  byte in_DL;
  ImGuiKey in_ESI;
  ImVector<ImGuiInputEvent> *in_RDI;
  float in_XMM0_Da;
  ImGuiInputEvent e;
  float latest_key_analog;
  bool latest_key_down;
  ImGuiKeyData *key_data;
  ImGuiInputEvent *latest_event;
  int n;
  ImGuiContext *g;
  float fVar5;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar6;
  int in_stack_ffffffffffffffa8;
  ImGuiInputEventType in_stack_ffffffffffffffac;
  int local_24;
  
  if ((in_ESI != ImGuiKey_KeysData_OFFSET) && ((in_RDI[0x37a].Size & 0x100) != 0)) {
    if (*(char *)((long)&in_RDI[0x37a].Size + 2) == -1) {
      for (local_24 = 0x200; local_24 < 0x28c; local_24 = local_24 + 1) {
      }
    }
    *(undefined1 *)((long)&in_RDI[0x37a].Size + 2) = 0;
    bVar2 = ImGui::IsGamepadKey(in_ESI);
    if (bVar2) {
      *(undefined1 *)((long)&in_RDI[0x37a].Size + 3) = 0;
    }
    pIVar3 = FindLatestInputEvent(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    pIVar4 = ImGui::GetKeyData((ImGuiKey)((ulong)in_RDI >> 0x20));
    if (pIVar3 == (ImGuiInputEvent *)0x0) {
      bVar1 = pIVar4->Down;
    }
    else {
      bVar1 = (pIVar3->field_2).MouseButton.Down;
    }
    uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
    if (pIVar3 == (ImGuiInputEvent *)0x0) {
      fVar5 = pIVar4->AnalogValue;
    }
    else {
      fVar5 = (pIVar3->field_2).Key.AnalogValue;
    }
    if ((((bVar1 & 1) != (in_DL & 1)) || (fVar5 != in_XMM0_Da)) || (NAN(fVar5) || NAN(in_XMM0_Da)))
    {
      ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x489e57);
      ImGui::IsGamepadKey(in_ESI);
      ImVector<ImGuiInputEvent>::push_back(in_RDI,(ImGuiInputEvent *)CONCAT44(uVar6,fVar5));
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG_IO("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None || !AppAcceptingEvents)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKeyOrModKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.
    IM_ASSERT(!ImGui::IsAliasKey(key)); // Backend cannot submit ImGuiKey_MouseXXX values they are automatically inferred from AddMouseXXX() events.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Filter duplicate (in particular: key mods and gamepad analog values are commonly spammed)
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Key, (int)key);
    const ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    const bool latest_key_down = latest_event ? latest_event->Key.Down : key_data->Down;
    const float latest_key_analog = latest_event ? latest_event->Key.AnalogValue : key_data->AnalogValue;
    if (latest_key_down == down && latest_key_analog == analog_value)
        return;

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}